

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityCosseratMesh::SetAsRectangularSection
          (ChElasticityCosseratMesh *this,double width_y,double width_z)

{
  vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  ChVector2<double> local_38;
  double local_28;
  double local_20;
  
  pCVar1 = (this->vertexes).
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->vertexes;
  if ((this->vertexes).
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->vertexes).
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  local_38.m_data[0] = width_y * 0.5;
  local_38.m_data[1] = width_z * 0.5;
  local_28 = local_38.m_data[0];
  local_20 = local_38.m_data[1];
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_38);
  local_38.m_data[0] = local_28;
  local_38.m_data[1] = width_z * -0.5;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_38);
  local_38.m_data[0] = width_y * -0.5;
  local_38.m_data[1] = width_z * -0.5;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_38);
  local_38.m_data[1] = local_20;
  local_38.m_data[0] = width_y * -0.5;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_38);
  pCVar2 = (this->triangles).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->triangles).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (this->triangles).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  local_38.m_data[0] = 2.12199579096527e-314;
  local_38.m_data[1]._0_4_ = 2;
  std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
  emplace_back<chrono::ChVector<int>>
            ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&this->triangles
             ,(ChVector<int> *)&local_38);
  local_38.m_data[0] = 4.24399158193054e-314;
  local_38.m_data[1] = (double)CONCAT44(local_38.m_data[1]._4_4_,3);
  std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
  emplace_back<chrono::ChVector<int>>
            ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&this->triangles
             ,(ChVector<int> *)&local_38);
  return;
}

Assistant:

void ChElasticityCosseratMesh::SetAsRectangularSection(double width_y, double width_z) {
    this->vertexes.clear();
    this->vertexes.push_back(ChVector2<>(width_y * 0.5, width_z * 0.5));
    this->vertexes.push_back(ChVector2<>(width_y * 0.5, -width_z * 0.5));
    this->vertexes.push_back(ChVector2<>(-width_y * 0.5, -width_z * 0.5));
    this->vertexes.push_back(ChVector2<>(-width_y * 0.5, width_z * 0.5));

    this->triangles.clear();
    this->triangles.push_back(ChVector<int>(0, 1, 2));
    this->triangles.push_back(ChVector<int>(0, 2, 3));

    // set Ks using Timoshenko-Gere formula for solid rect.shapes
    /*
    double poisson = this->E / (2.0 * this->G) - 1.0;
    this->Ks_y = 10.0 * (1.0 + poisson) / (12.0 + 11.0 * poisson);
    this->Ks_z = this->Ks_y;
    */
}